

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O2

bool FIX::operator<(DateTime *lhs,DateTime *rhs)

{
  bool bVar1;
  
  bVar1 = true;
  if (rhs->m_date <= lhs->m_date) {
    if (lhs->m_date <= rhs->m_date) {
      return lhs->m_time < rhs->m_time;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool operator<(const DateTime &lhs, const DateTime &rhs) {
  if (lhs.m_date < rhs.m_date) {
    return true;
  } else if (lhs.m_date > rhs.m_date) {
    return false;
  } else if (lhs.m_time < rhs.m_time) {
    return true;
  }
  return false;
}